

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::OrderDependsTargetForTarget_abi_cxx11_
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this)

{
  string local_38;
  cmNinjaTargetGenerator *local_18;
  cmNinjaTargetGenerator *this_local;
  
  local_18 = this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  GetTargetName_abi_cxx11_(&local_38,this);
  std::operator+(__return_storage_ptr__,"cmake_order_depends_target_",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmNinjaTargetGenerator::OrderDependsTargetForTarget()
{
  return "cmake_order_depends_target_" + this->GetTargetName();
}